

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O1

void __thiscall Parse::SMTLIB2::colorSymbol(SMTLIB2 *this,string *name,Color color)

{
  pointer pcVar1;
  long lVar2;
  Entry *pEVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  long local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char local_50 [32];
  
  pEVar3 = ::Lib::
           DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&this->_declaredSymbols,name);
  if (pEVar3 != (Entry *)0x0) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + name->_M_string_length);
    pEVar3 = ::Lib::
             DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&this->_declaredSymbols,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    DAT_00b7e200 = 1;
    Kernel::Signature::Symbol::addColor
              (*(Symbol **)
                (*(long *)(DAT_00b7e1b0 + 0x60 + (ulong)(pEVar3->_val).second * 0x20) +
                (ulong)(pEVar3->_val).first * 8),color);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
  std::operator+(&local_70,"\'",name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0 = (long *)*plVar5;
  plVar6 = plVar5 + 2;
  if (local_b0 == plVar6) {
    local_a0 = *plVar6;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar6;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f0 = (long *)*plVar5;
  plVar6 = plVar5 + 2;
  if (local_f0 == plVar6) {
    local_e0 = *plVar6;
    lStack_d8 = plVar5[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar6;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_90,this->_topLevelExpr,true);
  std::operator+(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  plVar6 = (long *)std::__cxx11::string::append(local_50);
  plVar5 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (plVar5 == plVar7) {
    local_100 = *plVar7;
    uStack_f8 = (undefined4)plVar6[3];
    uStack_f4 = *(undefined4 *)((long)plVar6 + 0x1c);
    plVar5 = &local_100;
  }
  else {
    local_100 = *plVar7;
  }
  lVar2 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  *puVar4 = &PTR_cry_00b69f40;
  puVar4[1] = puVar4 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar4 + 1),plVar5,lVar2 + (long)plVar5);
  *puVar4 = &PTR_cry_00b6a028;
  *(undefined4 *)(puVar4 + 5) = 0;
  puVar4[6] = puVar4 + 8;
  puVar4[7] = 0;
  *(undefined1 *)(puVar4 + 8) = 0;
  __cxa_throw(puVar4,&::Lib::UserErrorException::typeinfo,
              ::Lib::UserErrorException::~UserErrorException);
}

Assistant:

void SMTLIB2::colorSymbol(const std::string& name, Color color)
{
  if (!_declaredSymbols.find(name)) {
    USER_ERROR_EXPR("'"+name+"' is not a user symbol");
  }
  DeclaredSymbol& s = _declaredSymbols.get(name);

  env.colorUsed = true;

  Signature::Symbol* sym = getSymbol(s);
  sym->addColor(color);
}